

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::OneofOptions::MergeFrom(OneofOptions *this,Message *from)

{
  OneofOptions *pOVar1;
  OneofOptions *in_RDI;
  OneofOptions *unaff_retaddr;
  OneofOptions *source;
  Message *in_stack_000003c8;
  Message *in_stack_000003d0;
  
  pOVar1 = DynamicCastToGenerated<google::protobuf::OneofOptions>(&in_RDI->super_Message);
  if (pOVar1 == (OneofOptions *)0x0) {
    internal::ReflectionOps::Merge(in_stack_000003d0,in_stack_000003c8);
  }
  else {
    MergeFrom(unaff_retaddr,in_RDI);
  }
  return;
}

Assistant:

void OneofOptions::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.OneofOptions)
  GOOGLE_DCHECK_NE(&from, this);
  const OneofOptions* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<OneofOptions>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.OneofOptions)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.OneofOptions)
    MergeFrom(*source);
  }
}